

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

cbtHullTriangle ** __thiscall
ConvexDecomposition::Array<ConvexDecomposition::cbtHullTriangle_*>::Add
          (Array<ConvexDecomposition::cbtHullTriangle_*> *this,cbtHullTriangle *t)

{
  int iVar1;
  int s;
  
  iVar1 = this->array_size;
  if (this->count <= iVar1) {
    if (this->count == iVar1) {
      s = 0x10;
      if (iVar1 != 0) {
        s = iVar1 * 2;
      }
      allocate(this,s);
    }
    iVar1 = this->count;
    this->count = iVar1 + 1;
    this->element[iVar1] = t;
    return this->element + iVar1;
  }
  __assert_fail("count<=array_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x5e8,
                "Type &ConvexDecomposition::Array<ConvexDecomposition::cbtHullTriangle *>::Add(Type) [Type = ConvexDecomposition::cbtHullTriangle *]"
               );
}

Assistant:

Type& Array<Type>::Add(Type t)
{
	assert(count<=array_size);
	if(count==array_size)
	{
		allocate((array_size)?array_size *2:16);
	}
	element[count++] = t;
	return element[count-1];
}